

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMerge.c
# Opt level: O2

void Abc_NtkCollectCircle(Vec_Ptr_t *vStart,Vec_Ptr_t *vNext,int nFanMax)

{
  Abc_Obj_t *pAVar1;
  int iVar2;
  long *plVar3;
  int i;
  long lVar4;
  
  vNext->nSize = 0;
  for (i = 0; i < vStart->nSize; i = i + 1) {
    plVar3 = (long *)Vec_PtrEntry(vStart,i);
    for (lVar4 = 0; lVar4 < *(int *)((long)plVar3 + 0x1c); lVar4 = lVar4 + 1) {
      pAVar1 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                (long)*(int *)(plVar3[4] + lVar4 * 4) * 8);
      if ((*(uint *)&pAVar1->field_0x14 & 0xf) == 7) {
        iVar2 = Abc_NodeIsTravIdCurrent(pAVar1);
        if (iVar2 == 0) {
          Abc_NodeSetTravIdCurrent(pAVar1);
          Vec_PtrPush(vNext,pAVar1);
        }
      }
    }
    for (lVar4 = 0; lVar4 < *(int *)((long)plVar3 + 0x2c); lVar4 = lVar4 + 1) {
      pAVar1 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                (long)*(int *)(plVar3[6] + lVar4 * 4) * 8);
      if ((*(uint *)&pAVar1->field_0x14 & 0xf) == 7) {
        iVar2 = Abc_NodeIsTravIdCurrent(pAVar1);
        if (iVar2 == 0) {
          Abc_NodeSetTravIdCurrent(pAVar1);
          if ((pAVar1->vFanouts).nSize <= nFanMax) {
            Vec_PtrPush(vNext,pAVar1);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkCollectCircle( Vec_Ptr_t * vStart, Vec_Ptr_t * vNext, int nFanMax )
{
    Abc_Obj_t * pObj, * pNext;
    int i, k;
    Vec_PtrClear( vNext );
    Vec_PtrForEachEntry( Abc_Obj_t *, vStart, pObj, i )
    {
        Abc_ObjForEachFanin( pObj, pNext, k )
        {
            if ( !Abc_ObjIsNode(pNext) )
                continue;
            if ( Abc_NodeIsTravIdCurrent( pNext ) )
                continue;
            Abc_NodeSetTravIdCurrent( pNext );
            Vec_PtrPush( vNext, pNext );
        }
        Abc_ObjForEachFanout( pObj, pNext, k )
        {
            if ( !Abc_ObjIsNode(pNext) )
                continue;
            if ( Abc_NodeIsTravIdCurrent( pNext ) )
                continue;
            Abc_NodeSetTravIdCurrent( pNext );
            if ( Abc_ObjFanoutNum(pNext) > nFanMax )
                continue;
            Vec_PtrPush( vNext, pNext );
        }
    }
}